

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table_impl.h
# Opt level: O2

ht_item_t_conflict5
ht_insert(hash_table_t *ht,void *key,size_t len,ht_item_t_conflict5 new_item,int mode)

{
  void *pvVar1;
  uint __line;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  fb_value_t *extraout_RDX;
  fb_value_t *extraout_RDX_00;
  fb_value_t *item;
  ulong uVar5;
  char *__assertion;
  ht_item_t_conflict5 len_00;
  size_t *psVar6;
  size_t *psVar7;
  
  if (len == 2) {
    __assertion = "new_item != HT_DELETED";
    __line = 0x74;
  }
  else if (len == 1) {
    __assertion = "new_item != HT_NOMEM";
    __line = 0x75;
  }
  else {
    if (len != 0) {
      uVar4 = ht->count;
      sVar3 = ht->buckets;
      if (sVar3 * 0xb3 >> 8 <= uVar4) {
        uVar4 = uVar4 * 2;
        iVar2 = ht_resize(ht,uVar4);
        if (iVar2 != 0) {
          fprintf(_stderr,"aborting on panic: %s\n",
                  "hash table failed to allocate memory during resize");
          exit(1);
        }
        sVar3 = ht->buckets;
      }
      pvVar1 = ht->table;
      uVar5 = sVar3 - 1;
      sVar3 = value_hash_function(key,uVar4);
      uVar4 = sVar3 & uVar5;
      if (((uint)new_item & 0xfffffffe) != 2) {
        psVar6 = (size_t *)0x0;
        item = extraout_RDX;
        do {
          sVar3 = sVar3 + 1;
          psVar7 = (size_t *)((long)pvVar1 + uVar4 * 8);
          len_00 = (ht_item_t_conflict5)*psVar7;
          if (len_00 == (ht_item_t_conflict5)&DAT_00000002) {
            if (psVar6 == (size_t *)0x0) {
              psVar6 = psVar7;
            }
          }
          else {
            if (len_00 == (ht_item_t_conflict5)0x0) {
              if (psVar6 != (size_t *)0x0) {
                psVar7 = psVar6;
              }
              ht->count = ht->count + 1;
              len_00 = (ht_item_t_conflict5)0x0;
              goto LAB_00122ad2;
            }
            iVar2 = ht_match(key,(size_t)len_00,item);
            item = extraout_RDX_00;
            if (iVar2 != 0) goto LAB_00122ac6;
          }
          uVar4 = sVar3 & uVar5;
        } while( true );
      }
      ht->count = ht->count + 1;
      while (sVar3 = sVar3 + 1, (*(ulong *)((long)pvVar1 + uVar4 * 8) & 0xfffffffffffffffd) != 0) {
        uVar4 = sVar3 & uVar5;
      }
      psVar7 = (size_t *)((long)pvVar1 + uVar4 * 8);
      len_00 = (ht_item_t_conflict5)0x0;
      goto LAB_00122ad2;
    }
    __assertion = "new_item != HT_MISSING";
    __line = 0x73;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/external/hash/hash_table_impl.h"
                ,__line,"ht_item_t ht_insert(hash_table_t *, const void *, size_t, ht_item_t, int)")
  ;
LAB_00122ac6:
  if ((uint)new_item != 0) {
    return len_00;
  }
LAB_00122ad2:
  *psVar7 = len;
  return len_00;
}

Assistant:

static ht_item_t ht_insert(hash_table_t *ht,
        const void *key, size_t len, ht_item_t new_item, int mode)
{
    ht_item_t *T;
    size_t N, i, j, k;
    ht_item_t item, *vacant = 0;

    assert(new_item != HT_MISSING);
    assert(new_item != HT_DELETED);
    assert(new_item != HT_NOMEM);

    if (ht->count >= ht->buckets * (HT_LOAD_FACTOR_FRAC) / 256) {
        if (ht_resize(ht, ht->count * 2)) {
            HT_PANIC("hash table failed to allocate memory during resize");
            return HT_NOMEM;
        }
    }
    T = ht->table;
    N = ht->buckets - 1;
    k = HT_HASH_FUNCTION(key, len);
    i = 0;
    j = HT_PROBE(k, i, N);
    if (mode == ht_unique || mode == ht_multi) {
        ++ht->count;
        while (T[j] && T[j] != HT_DELETED) {
            ++i;
            j = HT_PROBE(k, i, N);
        }
        T[j] = new_item;
        return 0;
    }
    while ((item = T[j])) {
        if (item == HT_DELETED) {
            if (vacant == 0) {
                /*
                 * If a tombstone was found, use the first available,
                 * but continue search for possible match.
                 */
                vacant = &T[j];
            }
        } else if (ht_match(key, len, item)) {
            if (mode == ht_replace) {
                T[j] = new_item;
            }
            return item;
        }
        ++i;
        j = HT_PROBE(k, i, N);
    }
    if (vacant == 0) {
        vacant = &T[j];
    }
    ++ht->count;
    *vacant = new_item;
    return 0;
}